

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.c
# Opt level: O2

Step * Step_new(Location_conflict location,IdGenerator *id_generator,wchar_t *keyword,
               KeywordType keyword_type,wchar_t *text,StepArgument *argument)

{
  Step *pSVar1;
  wchar_t *pwVar2;
  
  pSVar1 = (Step *)malloc(0x40);
  pSVar1->step_delete = Step_delete;
  pSVar1->type = Gherkin_Step;
  (pSVar1->location).line = location.line;
  (pSVar1->location).column = location.column;
  pwVar2 = (*id_generator->new_id)(id_generator);
  pSVar1->id = pwVar2;
  if (keyword != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(keyword);
    pSVar1->keyword = pwVar2;
  }
  pSVar1->keyword_type = keyword_type;
  if (text != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(text);
    pSVar1->text = pwVar2;
  }
  pSVar1->argument = argument;
  return pSVar1;
}

Assistant:

const Step* Step_new(Location location, IdGenerator* id_generator, const wchar_t* keyword, const KeywordType keyword_type, const wchar_t* text, const StepArgument* argument) {
    Step* step = (Step*)malloc(sizeof(Step));
    step->step_delete = (item_delete_function)Step_delete;
    step->type = Gherkin_Step;
    step->location.line = location.line;
    step->location.column = location.column;
    step->id = id_generator->new_id(id_generator);
    if (keyword) {
        step->keyword = StringUtilities_copy_string(keyword);
    }
    step->keyword_type = keyword_type;
    if (text) {
        step->text = StringUtilities_copy_string(text);
    }
    step->argument = argument;
    return step;
}